

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor.h
# Opt level: O1

void __thiscall
Fixpp::Deferred<Fixpp::ErrorKind>::
construct<Fixpp::ErrorKind::Type&,unsigned_long&,std::__cxx11::string>
          (Deferred<Fixpp::ErrorKind> *this,Type *args,unsigned_long *args_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type *psVar2;
  Type TVar3;
  unsigned_long uVar4;
  size_type sVar5;
  size_type *local_28;
  size_type local_18;
  undefined8 uStack_10;
  
  TVar3 = *args;
  uVar4 = *args_1;
  local_28 = (size_type *)(args_2->_M_dataplus)._M_p;
  paVar1 = &args_2->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_28 == paVar1) {
    local_18 = paVar1->_M_allocated_capacity;
    uStack_10 = *(undefined8 *)((long)&args_2->field_2 + 8);
    local_28 = &local_18;
  }
  else {
    local_18 = paVar1->_M_allocated_capacity;
  }
  sVar5 = args_2->_M_string_length;
  (args_2->_M_dataplus)._M_p = (pointer)paVar1;
  args_2->_M_string_length = 0;
  (args_2->field_2)._M_local_buf[0] = '\0';
  *(Type *)&this->storage_ = TVar3;
  *(unsigned_long *)((long)&this->storage_ + 8) = uVar4;
  psVar2 = (size_type *)((long)&this->storage_ + 0x20);
  *(size_type **)((long)&this->storage_ + 0x10) = psVar2;
  if (local_28 == &local_18) {
    *psVar2 = local_18;
    *(undefined8 *)((long)&this->storage_ + 0x28) = uStack_10;
  }
  else {
    *(size_type **)((long)&this->storage_ + 0x10) = local_28;
    *(size_type *)((long)&this->storage_ + 0x20) = local_18;
  }
  *(size_type *)((long)&this->storage_ + 0x18) = sVar5;
  this->empty_ = false;
  return;
}

Assistant:

void construct(Args&& ...args)
        {
            new (&storage_) T(std::forward<Args>(args)...);
            empty_ = false;
        }